

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcolr.c
# Opt level: O1

FT_Bool tt_face_get_paint(TT_Face face,FT_OpaquePaint opaque_paint,FT_COLR_Paint *paint)

{
  FT_F2Dot14 *pFVar1;
  FT_Bool *pFVar2;
  FT_Pos *pFVar3;
  FT_Vector *pFVar4;
  FT_Affine23 *pFVar5;
  FT_OpaquePaint *pFVar6;
  byte bVar7;
  FT_PaintFormat FVar8;
  Colr *colr;
  void *pvVar9;
  FT_Size pFVar10;
  FT_Face_Internal pFVar11;
  uint *puVar12;
  FT_ULong FVar13;
  FT_Bool FVar14;
  long lVar15;
  short sVar16;
  uint uVar17;
  FT_UInt num_deltas;
  FT_Fixed FVar18;
  uint *puVar19;
  FT_Pos FVar20;
  uint *puVar21;
  ulong uVar22;
  bool read_variable;
  FT_Byte *child_table_p;
  uint *local_68;
  byte *local_60;
  FT_Matrix local_58;
  
  puVar19 = (uint *)opaque_paint.p;
  colr = (Colr *)face->colr;
  if (((colr != (Colr *)0x0) && (colr->base_glyphs_v1 != (FT_Byte *)0x0)) &&
     (pvVar9 = colr->table, pvVar9 != (void *)0x0)) {
    if (opaque_paint.insert_root_transform != '\0') {
      paint->format = FT_COLR_PAINTFORMAT_TRANSFORM;
      (paint->u).glyph.paint.p = (FT_Byte *)puVar19;
      *(undefined1 *)((long)&paint->u + 8) = 0;
      pFVar10 = (face->root).size;
      local_58.xx = (pFVar10->metrics).x_scale + 0x20 >> 6;
      local_58.xy = 0;
      local_58.yx = 0;
      local_58.yy = (pFVar10->metrics).y_scale + 0x20 >> 6;
      pFVar11 = (face->root).internal;
      if ((pFVar11->transform_flags & 1) != 0) {
        FT_Matrix_Multiply(&pFVar11->transform_matrix,&local_58);
      }
      (paint->u).transform.affine.xx = local_58.xx;
      (paint->u).transform.affine.xy = local_58.xy;
      (paint->u).linear_gradient.p0.y = local_58.yx;
      (paint->u).linear_gradient.p1.x = local_58.yy;
      pFVar11 = (face->root).internal;
      if ((pFVar11->transform_flags & 2) == 0) {
        lVar15 = 0;
        (paint->u).linear_gradient.p0.x = 0;
      }
      else {
        (paint->u).linear_gradient.p0.x = (pFVar11->transform_delta).x << 10;
        lVar15 = (((face->root).internal)->transform_delta).y << 10;
      }
      (paint->u).linear_gradient.p1.y = lVar15;
      return '\x01';
    }
    local_60 = (byte *)0x0;
    local_58.yx = 0;
    local_58.xx = 0;
    local_58.xy = 0;
    if (puVar19 == (uint *)0x0) {
      return '\0';
    }
    puVar12 = (uint *)colr->paints_start_v1;
    if (puVar12 <= puVar19) {
      FVar13 = colr->table_size;
      puVar21 = (uint *)((long)pvVar9 + (FVar13 - 2));
      if (puVar19 <= puVar21) {
        local_68 = (uint *)((long)puVar19 + 1);
        bVar7 = (byte)*puVar19;
        paint->format = (uint)bVar7;
        if (bVar7 < FT_COLR_PAINT_FORMAT_MAX) {
          if (bVar7 - 2 < 2) {
            if (local_68 <= (uint *)((long)pvVar9 + (FVar13 - 4)) && puVar12 <= local_68) {
              (paint->u).solid.color.palette_index =
                   *(ushort *)((long)puVar19 + 1) << 8 | *(ushort *)((long)puVar19 + 1) >> 8;
              (paint->u).solid.color.alpha =
                   *(ushort *)((long)puVar19 + 3) << 8 | *(ushort *)((long)puVar19 + 3) >> 8;
              if (bVar7 == 3) {
                if ((byte *)((long)puVar19 + 5U) < colr->paints_start_v1) {
                  return '\0';
                }
                if ((byte *)((long)colr->table + (colr->table_size - 4)) <
                    (byte *)((long)puVar19 + 5U)) {
                  return '\0';
                }
                local_68 = (uint *)((long)puVar19 + 9);
                uVar17 = *(uint *)((long)puVar19 + 5);
                get_deltas_for_var_index_base
                          (face,colr,
                           (ulong)(uVar17 >> 0x18 | (uVar17 & 0xff0000) >> 8 |
                                   (uVar17 & 0xff00) << 8 | uVar17 << 0x18),1,
                           (FT_ItemVarDelta *)&local_58);
                pFVar1 = &(paint->u).solid.color.alpha;
                *pFVar1 = *pFVar1 + (short)local_58.xx;
              }
              paint->format = FT_COLR_PAINTFORMAT_SOLID;
              return '\x01';
            }
          }
          else if (bVar7 == 0xb) {
            if (local_68 <= puVar21 && puVar12 <= local_68) {
              *(uint *)&paint->u =
                   (uint)(ushort)(*(ushort *)((long)puVar19 + 1) << 8 |
                                 *(ushort *)((long)puVar19 + 1) >> 8);
              return '\x01';
            }
          }
          else if (bVar7 == 1) {
            bVar7 = *(byte *)((long)puVar19 + 1);
            if ((ulong)bVar7 <= colr->num_layers_v1) {
              uVar17 = *(uint *)((long)puVar19 + 2);
              uVar17 = uVar17 >> 0x18 | (uVar17 & 0xff0000) >> 8 | (uVar17 & 0xff00) << 8 |
                       uVar17 << 0x18;
              if ((ulong)(uVar17 + bVar7) <= colr->num_layers_v1) {
                *(uint *)&paint->u = (uint)bVar7;
                (paint->u).colr_layers.layer_iterator.layer = 0;
                *(FT_Byte **)&(paint->u).glyph.paint.insert_root_transform =
                     colr->layers_v1 + (ulong)(uVar17 << 2) + 4;
                return '\x01';
              }
            }
          }
          else {
            FVar14 = get_child_table_pointer
                               (colr,(FT_Byte *)puVar19,(FT_Byte **)&local_68,&local_60);
            if (FVar14 != '\0') {
              FVar8 = paint->format;
              if (FVar8 == FT_COLR_PAINTFORMAT_LINEAR_GRADIENT) {
                read_variable = false;
              }
              else {
                read_variable =
                     FVar8 == (FT_COLR_PAINTFORMAT_LINEAR_GRADIENT|FT_COLR_PAINTFORMAT_COLR_LAYERS);
                if (!read_variable) {
                  if ((FVar8 == FT_COLR_PAINTFORMAT_RADIAL_GRADIENT) ||
                     (read_variable =
                           FVar8 == (FT_COLR_PAINTFORMAT_RADIAL_GRADIENT|
                                    FT_COLR_PAINTFORMAT_COLR_LAYERS), read_variable)) {
                    FVar14 = read_color_line(colr,local_60,(FT_ColorLine *)&(paint->u).colr_layers,
                                             read_variable);
                    if (FVar14 == '\0') {
                      return '\0';
                    }
                    if (local_68 < colr->paints_start_v1) {
                      return '\0';
                    }
                    if ((uint *)((long)colr->table + (colr->table_size - 0xc)) < local_68) {
                      return '\0';
                    }
                    (paint->u).linear_gradient.p0.x =
                         ((long)(short)((ushort)(byte)*local_68 << 8) |
                         (ulong)*(byte *)((long)local_68 + 1)) << 0x10;
                    (paint->u).linear_gradient.p0.y =
                         ((long)(short)((ushort)*(byte *)((long)local_68 + 2) << 8) |
                         (ulong)*(byte *)((long)local_68 + 3)) << 0x10;
                    sVar16 = (ushort)(byte)local_68[1] << 8;
                    FVar20 = ((long)sVar16 | (ulong)*(byte *)((long)local_68 + 5)) << 0x10;
                    if (sVar16 < 0) {
                      FVar20 = 0x7fffffff;
                    }
                    (paint->u).linear_gradient.p1.x = FVar20;
                    (paint->u).linear_gradient.p1.y =
                         ((long)(short)((ushort)*(byte *)((long)local_68 + 6) << 8) |
                         (ulong)*(byte *)((long)local_68 + 7)) << 0x10;
                    (paint->u).linear_gradient.p2.x =
                         ((long)(short)((ushort)(byte)local_68[2] << 8) |
                         (ulong)*(byte *)((long)local_68 + 9)) << 0x10;
                    sVar16 = (ushort)*(byte *)((long)local_68 + 10) << 8;
                    FVar20 = ((long)sVar16 | (ulong)*(byte *)((long)local_68 + 0xb)) << 0x10;
                    if (sVar16 < 0) {
                      FVar20 = 0x7fffffff;
                    }
                    (paint->u).linear_gradient.p2.y = FVar20;
                    if (read_variable != false) {
                      if (local_68 + 3 < colr->paints_start_v1) {
                        return '\0';
                      }
                      if ((uint *)((long)colr->table + (colr->table_size - 4)) < local_68 + 3) {
                        return '\0';
                      }
                      uVar17 = local_68[3];
                      local_68 = local_68 + 4;
                      get_deltas_for_var_index_base
                                (face,colr,
                                 (ulong)(uVar17 >> 0x18 | (uVar17 & 0xff0000) >> 8 |
                                         (uVar17 & 0xff00) << 8 | uVar17 << 0x18),6,
                                 (FT_ItemVarDelta *)&local_58);
                      pFVar2 = &(paint->u).composite.backdrop_paint.insert_root_transform;
                      *(long *)pFVar2 = *(long *)pFVar2 + (long)(int)local_58.xx * 0x10000;
                      pFVar3 = &(paint->u).linear_gradient.p0.y;
                      *pFVar3 = *pFVar3 + (long)local_58.xx._4_4_ * 0x10000;
                      pFVar4 = &(paint->u).linear_gradient.p1;
                      pFVar4->x = pFVar4->x + (long)(int)local_58.xy * 0x10000;
                      pFVar3 = &(paint->u).linear_gradient.p1.y;
                      *pFVar3 = *pFVar3 + (long)local_58.xy._4_4_ * 0x10000;
                      pFVar4 = &(paint->u).linear_gradient.p2;
                      pFVar4->x = pFVar4->x + (long)(int)local_58.yx * 0x10000;
                      pFVar3 = &(paint->u).linear_gradient.p2.y;
                      *pFVar3 = *pFVar3 + (long)local_58.yx._4_4_ * 0x10000;
                    }
                    paint->format = FT_COLR_PAINTFORMAT_RADIAL_GRADIENT;
                    return '\x01';
                  }
                  if ((FVar8 == FT_COLR_PAINTFORMAT_SWEEP_GRADIENT) ||
                     (read_variable =
                           FVar8 == (FT_COLR_PAINTFORMAT_SWEEP_GRADIENT|
                                    FT_COLR_PAINTFORMAT_COLR_LAYERS), read_variable)) {
                    FVar14 = read_color_line(colr,local_60,(FT_ColorLine *)&(paint->u).colr_layers,
                                             read_variable);
                    if (FVar14 == '\0') {
                      return '\0';
                    }
                    if (local_68 < colr->paints_start_v1) {
                      return '\0';
                    }
                    if ((uint *)((long)colr->table + (colr->table_size - 8)) < local_68) {
                      return '\0';
                    }
                    (paint->u).linear_gradient.p0.x =
                         ((long)(short)((ushort)(byte)*local_68 << 8) |
                         (ulong)*(byte *)((long)local_68 + 1)) << 0x10;
                    (paint->u).linear_gradient.p0.y =
                         ((long)(short)((ushort)*(byte *)((long)local_68 + 2) << 8) |
                         (ulong)*(byte *)((long)local_68 + 3)) << 0x10;
                    (paint->u).linear_gradient.p1.x =
                         ((long)(short)((ushort)(byte)local_68[1] << 8) |
                         (ulong)*(byte *)((long)local_68 + 5)) << 2;
                    (paint->u).linear_gradient.p1.y =
                         ((long)(short)((ushort)*(byte *)((long)local_68 + 6) << 8) |
                         (ulong)*(byte *)((long)local_68 + 7)) << 2;
                    if (read_variable != false) {
                      if (local_68 + 2 < colr->paints_start_v1) {
                        return '\0';
                      }
                      if ((uint *)((long)colr->table + (colr->table_size - 4)) < local_68 + 2) {
                        return '\0';
                      }
                      uVar17 = local_68[2];
                      local_68 = local_68 + 3;
                      get_deltas_for_var_index_base
                                (face,colr,
                                 (ulong)(uVar17 >> 0x18 | (uVar17 & 0xff0000) >> 8 |
                                         (uVar17 & 0xff00) << 8 | uVar17 << 0x18),4,
                                 (FT_ItemVarDelta *)&local_58);
                      pFVar2 = &(paint->u).composite.backdrop_paint.insert_root_transform;
                      *(long *)pFVar2 = *(long *)pFVar2 + (long)(int)local_58.xx * 0x10000;
                      pFVar3 = &(paint->u).linear_gradient.p0.y;
                      *pFVar3 = *pFVar3 + (long)local_58.xx._4_4_ * 0x10000;
                      pFVar4 = &(paint->u).linear_gradient.p1;
                      pFVar4->x = pFVar4->x + (long)(int)local_58.xy * 4;
                      pFVar3 = &(paint->u).linear_gradient.p1.y;
                      *pFVar3 = *pFVar3 + (long)local_58.xy._4_4_ * 4;
                    }
                    paint->format = FT_COLR_PAINTFORMAT_SWEEP_GRADIENT;
                    return '\x01';
                  }
                  if (FVar8 - FT_COLR_PAINTFORMAT_TRANSFORM < 2) {
                    (paint->u).glyph.paint.p = local_60;
                    *(undefined1 *)((long)&paint->u + 8) = 0;
                    FVar14 = get_child_table_pointer
                                       (colr,(FT_Byte *)puVar19,(FT_Byte **)&local_68,&local_60);
                    if (FVar14 == '\0') {
                      return '\0';
                    }
                    if (local_60 < colr->paints_start_v1) {
                      return '\0';
                    }
                    if ((byte *)((long)colr->table + (colr->table_size - 0x18)) < local_60) {
                      return '\0';
                    }
                    (paint->u).transform.affine.xx =
                         (ulong)local_60[3] |
                         (ulong)local_60[2] << 8 |
                         (long)(int)((uint)*local_60 << 0x18) | (ulong)local_60[1] << 0x10;
                    (paint->u).linear_gradient.p0.y =
                         (ulong)local_60[7] |
                         (ulong)local_60[6] << 8 |
                         (long)(int)((uint)local_60[4] << 0x18) | (ulong)local_60[5] << 0x10;
                    (paint->u).transform.affine.xy =
                         (ulong)local_60[0xb] |
                         (ulong)local_60[10] << 8 |
                         (long)(int)((uint)local_60[8] << 0x18) | (ulong)local_60[9] << 0x10;
                    (paint->u).linear_gradient.p1.x =
                         (ulong)local_60[0xf] |
                         (ulong)local_60[0xe] << 8 |
                         (long)(int)((uint)local_60[0xc] << 0x18) | (ulong)local_60[0xd] << 0x10;
                    (paint->u).linear_gradient.p0.x =
                         (ulong)local_60[0x13] |
                         (ulong)local_60[0x12] << 8 |
                         (long)(int)((uint)local_60[0x10] << 0x18) | (ulong)local_60[0x11] << 0x10;
                    (paint->u).linear_gradient.p1.y =
                         (ulong)local_60[0x17] |
                         (ulong)local_60[0x16] << 8 |
                         (long)(int)((uint)local_60[0x14] << 0x18) | (ulong)local_60[0x15] << 0x10;
                    if (paint->format ==
                        (FT_COLR_PAINTFORMAT_TRANSFORM|FT_COLR_PAINTFORMAT_COLR_LAYERS)) {
                      if (local_60 + 0x18 < colr->paints_start_v1) {
                        return '\0';
                      }
                      if ((byte *)((long)colr->table + (colr->table_size - 4)) < local_60 + 0x18) {
                        return '\0';
                      }
                      local_68 = (uint *)(local_60 + 0x1c);
                      uVar17 = *(uint *)(local_60 + 0x18);
                      get_deltas_for_var_index_base
                                (face,colr,
                                 (ulong)(uVar17 >> 0x18 | (uVar17 & 0xff0000) >> 8 |
                                         (uVar17 & 0xff00) << 8 | uVar17 << 0x18),6,
                                 (FT_ItemVarDelta *)&local_58);
                      pFVar5 = &(paint->u).transform.affine;
                      pFVar5->xx = pFVar5->xx + (long)(int)local_58.xx;
                      pFVar3 = &(paint->u).linear_gradient.p0.y;
                      *pFVar3 = *pFVar3 + (long)local_58.xx._4_4_;
                      pFVar6 = &(paint->u).composite.backdrop_paint;
                      pFVar6->p = pFVar6->p + (int)local_58.xy;
                      pFVar4 = &(paint->u).linear_gradient.p1;
                      pFVar4->x = pFVar4->x + (long)local_58.xy._4_4_;
                      pFVar2 = &(paint->u).composite.backdrop_paint.insert_root_transform;
                      *(long *)pFVar2 = *(long *)pFVar2 + (long)(int)local_58.yx;
                      pFVar3 = &(paint->u).linear_gradient.p1.y;
                      *pFVar3 = *pFVar3 + (long)local_58.yx._4_4_;
                    }
                    paint->format = FT_COLR_PAINTFORMAT_TRANSFORM;
                    return '\x01';
                  }
                  if (FVar8 - FT_COLR_PAINTFORMAT_TRANSLATE < 2) {
                    (paint->u).glyph.paint.p = local_60;
                    *(undefined1 *)((long)&paint->u + 8) = 0;
                    if (local_68 < colr->paints_start_v1) {
                      return '\0';
                    }
                    if ((uint *)((long)colr->table + (colr->table_size - 4)) < local_68) {
                      return '\0';
                    }
                    (paint->u).transform.affine.xx =
                         ((long)(short)((ushort)(byte)*local_68 << 8) |
                         (ulong)*(byte *)((long)local_68 + 1)) << 0x10;
                    (paint->u).transform.affine.xy =
                         ((long)(short)((ushort)*(byte *)((long)local_68 + 2) << 8) |
                         (ulong)*(byte *)((long)local_68 + 3)) << 0x10;
                    if (FVar8 == (FT_COLR_PAINTFORMAT_TRANSLATE|FT_COLR_PAINTFORMAT_COLR_LAYERS)) {
                      if (local_68 + 1 < colr->paints_start_v1) {
                        return '\0';
                      }
                      if ((uint *)((long)colr->table + (colr->table_size - 4)) < local_68 + 1) {
                        return '\0';
                      }
                      uVar17 = local_68[1];
                      local_68 = local_68 + 2;
                      get_deltas_for_var_index_base
                                (face,colr,
                                 (ulong)(uVar17 >> 0x18 | (uVar17 & 0xff0000) >> 8 |
                                         (uVar17 & 0xff00) << 8 | uVar17 << 0x18),2,
                                 (FT_ItemVarDelta *)&local_58);
                      pFVar5 = &(paint->u).transform.affine;
                      pFVar5->xx = pFVar5->xx + (long)(int)local_58.xx * 0x10000;
                      pFVar6 = &(paint->u).composite.backdrop_paint;
                      pFVar6->p = pFVar6->p + (long)local_58.xx._4_4_ * 0x10000;
                    }
                    paint->format = FT_COLR_PAINTFORMAT_TRANSLATE;
                    return '\x01';
                  }
                  if (FVar8 == FT_COLR_PAINTFORMAT_GLYPH) {
                    if (local_68 < colr->paints_start_v1) {
                      return '\0';
                    }
                    if ((uint *)((long)colr->table + (colr->table_size - 2)) < local_68) {
                      return '\0';
                    }
                    (paint->u).glyph.paint.p = local_60;
                    *(undefined1 *)((long)&paint->u + 8) = 0;
                    *(uint *)((long)&paint->u + 0x10) =
                         (uint)(ushort)((ushort)*local_68 << 8 | (ushort)*local_68 >> 8);
                    return '\x01';
                  }
                  if ((FVar8 & ~(FT_COLR_PAINTFORMAT_RADIAL_GRADIENT|FT_COLR_PAINTFORMAT_COLR_LAYERS
                                )) == FT_COLR_PAINTFORMAT_SCALE) {
                    (paint->u).glyph.paint.p = local_60;
                    *(undefined1 *)((long)&paint->u + 8) = 0;
                    if (local_68 < colr->paints_start_v1) {
                      return '\0';
                    }
                    if ((uint *)((long)colr->table + (colr->table_size - 2)) < local_68) {
                      return '\0';
                    }
                    puVar19 = (uint *)((long)local_68 + 2);
                    FVar18 = ((long)(short)((ushort)(byte)*local_68 << 8) |
                             (ulong)*(byte *)((long)local_68 + 1)) << 2;
                    (paint->u).transform.affine.xx = FVar18;
                    if ((FVar8 & (FT_COLR_PAINTFORMAT_SCALE|FT_COLR_PAINTFORMAT_LINEAR_GRADIENT)) ==
                        FT_COLR_PAINTFORMAT_SCALE) {
                      if (puVar19 < colr->paints_start_v1) {
                        return '\0';
                      }
                      if ((uint *)((long)colr->table + (colr->table_size - 2)) < puVar19) {
                        return '\0';
                      }
                      FVar18 = ((long)(short)((ushort)*(byte *)((long)local_68 + 2) << 8) |
                               (ulong)*(byte *)((long)local_68 + 3)) << 2;
                      puVar19 = local_68 + 1;
                    }
                    local_68 = puVar19;
                    (paint->u).transform.affine.xy = FVar18;
                    if ((FVar8 < FT_COLR_PAINTFORMAT_ROTATE) &&
                       ((0xcc0000U >>
                         (FVar8 & (FT_COLR_PAINTFORMAT_SKEW|FT_COLR_PAINTFORMAT_SOLID|
                                  FT_COLR_PAINTFORMAT_COLR_LAYERS)) & 1) != 0)) {
                      if (local_68 < colr->paints_start_v1) {
                        return '\0';
                      }
                      if ((uint *)((long)colr->table + (colr->table_size - 4)) < local_68) {
                        return '\0';
                      }
                      (paint->u).linear_gradient.p0.x =
                           ((long)(short)((ushort)(byte)*local_68 << 8) |
                           (ulong)*(byte *)((long)local_68 + 1)) << 0x10;
                      (paint->u).linear_gradient.p0.y =
                           ((long)(short)((ushort)*(byte *)((long)local_68 + 2) << 8) |
                           (ulong)*(byte *)((long)local_68 + 3)) << 0x10;
                      local_68 = local_68 + 1;
                    }
                    else {
                      (paint->u).linear_gradient.p0.x = 0;
                      (paint->u).linear_gradient.p0.y = 0;
                    }
                    if ((FVar8 < FT_COLR_PAINTFORMAT_ROTATE) &&
                       ((0xaa0000U >>
                         (FVar8 & (FT_COLR_PAINTFORMAT_SKEW|FT_COLR_PAINTFORMAT_SOLID|
                                  FT_COLR_PAINTFORMAT_COLR_LAYERS)) & 1) != 0)) {
                      if (local_68 < colr->paints_start_v1) {
                        return '\0';
                      }
                      if ((uint *)((long)colr->table + (colr->table_size - 4)) < local_68) {
                        return '\0';
                      }
                      puVar19 = local_68 + 1;
                      uVar17 = *local_68;
                      uVar22 = (ulong)(uVar17 >> 0x18 | (uVar17 & 0xff0000) >> 8 |
                                       (uVar17 & 0xff00) << 8 | uVar17 << 0x18);
                      local_68 = puVar19;
                      if (FVar8 == (FT_COLR_PAINTFORMAT_SCALE|FT_COLR_PAINTFORMAT_COLR_LAYERS)) {
                        get_deltas_for_var_index_base
                                  (face,colr,uVar22,2,(FT_ItemVarDelta *)&local_58);
                        pFVar5 = &(paint->u).transform.affine;
                        pFVar5->xx = pFVar5->xx + (long)(int)local_58.xx * 4;
                        pFVar6 = &(paint->u).composite.backdrop_paint;
                        pFVar6->p = pFVar6->p + (long)local_58.xx._4_4_ * 4;
                      }
                      if (paint->format ==
                          (FT_COLR_PAINTFORMAT_SCALE|FT_COLR_PAINTFORMAT_SOLID|
                          FT_COLR_PAINTFORMAT_COLR_LAYERS)) {
                        get_deltas_for_var_index_base
                                  (face,colr,uVar22,4,(FT_ItemVarDelta *)&local_58);
                        pFVar5 = &(paint->u).transform.affine;
                        pFVar5->xx = pFVar5->xx + (long)(int)local_58.xx * 4;
                        pFVar6 = &(paint->u).composite.backdrop_paint;
                        pFVar6->p = pFVar6->p + (long)local_58.xx._4_4_ * 4;
                        pFVar2 = &(paint->u).composite.backdrop_paint.insert_root_transform;
                        *(long *)pFVar2 = *(long *)pFVar2 + (long)(int)local_58.xy * 0x10000;
                        pFVar3 = &(paint->u).linear_gradient.p0.y;
                        *pFVar3 = *pFVar3 + (long)local_58.xy._4_4_ * 0x10000;
                      }
                      if (paint->format ==
                          (FT_COLR_PAINTFORMAT_SCALE|FT_COLR_PAINTFORMAT_LINEAR_GRADIENT|
                          FT_COLR_PAINTFORMAT_COLR_LAYERS)) {
                        get_deltas_for_var_index_base
                                  (face,colr,uVar22,1,(FT_ItemVarDelta *)&local_58);
                        pFVar5 = &(paint->u).transform.affine;
                        pFVar5->xx = pFVar5->xx + (long)(int)local_58.xx * 4;
                        pFVar6 = &(paint->u).composite.backdrop_paint;
                        pFVar6->p = pFVar6->p + (long)(int)local_58.xx * 4;
                      }
                      if (paint->format ==
                          (FT_COLR_PAINTFORMAT_SCALE|FT_COLR_PAINTFORMAT_RADIAL_GRADIENT|
                          FT_COLR_PAINTFORMAT_COLR_LAYERS)) {
                        get_deltas_for_var_index_base
                                  (face,colr,uVar22,3,(FT_ItemVarDelta *)&local_58);
                        pFVar5 = &(paint->u).transform.affine;
                        pFVar5->xx = pFVar5->xx + (long)(int)local_58.xx * 4;
                        pFVar6 = &(paint->u).composite.backdrop_paint;
                        pFVar6->p = pFVar6->p + (long)(int)local_58.xx * 4;
                        pFVar2 = &(paint->u).composite.backdrop_paint.insert_root_transform;
                        *(long *)pFVar2 = *(long *)pFVar2 + (long)local_58.xx._4_4_ * 0x10000;
                        pFVar3 = &(paint->u).linear_gradient.p0.y;
                        *pFVar3 = *pFVar3 + (long)(int)local_58.xy * 0x10000;
                      }
                    }
                    paint->format = FT_COLR_PAINTFORMAT_SCALE;
                    return '\x01';
                  }
                  if (FVar8 - FT_COLR_PAINTFORMAT_ROTATE < 4) {
                    (paint->u).glyph.paint.p = local_60;
                    *(undefined1 *)((long)&paint->u + 8) = 0;
                    if (local_68 < colr->paints_start_v1) {
                      return '\0';
                    }
                    if ((uint *)((long)colr->table + (colr->table_size - 2)) < local_68) {
                      return '\0';
                    }
                    puVar19 = (uint *)((long)local_68 + 2);
                    (paint->u).transform.affine.xx =
                         ((long)(short)((ushort)(byte)*local_68 << 8) |
                         (ulong)*(byte *)((long)local_68 + 1)) << 2;
                    if ((FVar8 & ~FT_COLR_PAINTFORMAT_COLR_LAYERS) ==
                        (FT_COLR_PAINTFORMAT_ROTATE|FT_COLR_PAINTFORMAT_SOLID)) {
                      if (puVar19 < colr->paints_start_v1) {
                        return '\0';
                      }
                      if ((uint *)((long)colr->table + (colr->table_size - 4)) < puVar19) {
                        return '\0';
                      }
                      (paint->u).transform.affine.xy =
                           ((long)(short)((ushort)*(byte *)((long)local_68 + 2) << 8) |
                           (ulong)*(byte *)((long)local_68 + 3)) << 0x10;
                      (paint->u).linear_gradient.p0.x =
                           ((long)(short)((ushort)(byte)local_68[1] << 8) |
                           (ulong)*(byte *)((long)local_68 + 5)) << 0x10;
                      local_68 = (uint *)((long)local_68 + 6);
                    }
                    else {
                      (paint->u).transform.affine.xy = 0;
                      (paint->u).linear_gradient.p0.x = 0;
                      local_68 = puVar19;
                    }
                    if ((FVar8 | FT_COLR_PAINTFORMAT_SOLID) ==
                        (FT_COLR_PAINTFORMAT_ROTATE|FT_COLR_PAINTFORMAT_SOLID|
                        FT_COLR_PAINTFORMAT_COLR_LAYERS)) {
                      if (local_68 < colr->paints_start_v1) {
                        return '\0';
                      }
                      if ((uint *)((long)colr->table + (colr->table_size - 4)) < local_68) {
                        return '\0';
                      }
                      num_deltas = 1;
                      if (FVar8 != (FT_COLR_PAINTFORMAT_ROTATE|FT_COLR_PAINTFORMAT_COLR_LAYERS)) {
                        num_deltas = (uint)(FVar8 == (FT_COLR_PAINTFORMAT_ROTATE|
                                                      FT_COLR_PAINTFORMAT_SOLID|
                                                     FT_COLR_PAINTFORMAT_COLR_LAYERS)) * 3;
                      }
                      if (num_deltas != 0) {
                        uVar17 = *local_68;
                        local_68 = local_68 + 1;
                        get_deltas_for_var_index_base
                                  (face,colr,
                                   (ulong)(uVar17 >> 0x18 | (uVar17 & 0xff0000) >> 8 |
                                           (uVar17 & 0xff00) << 8 | uVar17 << 0x18),num_deltas,
                                   (FT_ItemVarDelta *)&local_58);
                        pFVar5 = &(paint->u).transform.affine;
                        pFVar5->xx = pFVar5->xx + (long)(int)local_58.xx * 4;
                        if (FVar8 == (FT_COLR_PAINTFORMAT_ROTATE|FT_COLR_PAINTFORMAT_SOLID|
                                     FT_COLR_PAINTFORMAT_COLR_LAYERS)) {
                          pFVar6 = &(paint->u).composite.backdrop_paint;
                          pFVar6->p = pFVar6->p + (long)local_58.xx._4_4_ * 0x10000;
                          pFVar2 = &(paint->u).composite.backdrop_paint.insert_root_transform;
                          *(long *)pFVar2 = *(long *)pFVar2 + (long)(int)local_58.xy * 0x10000;
                        }
                      }
                    }
                    paint->format = FT_COLR_PAINTFORMAT_ROTATE;
                    return '\x01';
                  }
                  if (FVar8 - FT_COLR_PAINTFORMAT_SKEW < 4) {
                    (paint->u).glyph.paint.p = local_60;
                    *(undefined1 *)((long)&paint->u + 8) = 0;
                    if (local_68 < colr->paints_start_v1) {
                      return '\0';
                    }
                    if ((uint *)((long)colr->table + (colr->table_size - 4)) < local_68) {
                      return '\0';
                    }
                    (paint->u).transform.affine.xx =
                         ((long)(short)((ushort)(byte)*local_68 << 8) |
                         (ulong)*(byte *)((long)local_68 + 1)) << 2;
                    puVar19 = local_68 + 1;
                    (paint->u).transform.affine.xy =
                         ((long)(short)((ushort)*(byte *)((long)local_68 + 2) << 8) |
                         (ulong)*(byte *)((long)local_68 + 3)) << 2;
                    if ((FVar8 & ~FT_COLR_PAINTFORMAT_COLR_LAYERS) ==
                        (FT_COLR_PAINTFORMAT_SKEW|FT_COLR_PAINTFORMAT_SOLID)) {
                      if (puVar19 < colr->paints_start_v1) {
                        return '\0';
                      }
                      if ((uint *)((long)colr->table + (colr->table_size - 4)) < puVar19) {
                        return '\0';
                      }
                      (paint->u).linear_gradient.p0.x =
                           ((long)(short)((ushort)(byte)local_68[1] << 8) |
                           (ulong)*(byte *)((long)local_68 + 5)) << 0x10;
                      (paint->u).linear_gradient.p0.y =
                           ((long)(short)((ushort)*(byte *)((long)local_68 + 6) << 8) |
                           (ulong)*(byte *)((long)local_68 + 7)) << 0x10;
                      local_68 = local_68 + 2;
                    }
                    else {
                      (paint->u).linear_gradient.p0.x = 0;
                      (paint->u).linear_gradient.p0.y = 0;
                      local_68 = puVar19;
                    }
                    if ((FVar8 | FT_COLR_PAINTFORMAT_SOLID) ==
                        (FT_COLR_PAINTFORMAT_SKEW|FT_COLR_PAINTFORMAT_SOLID|
                        FT_COLR_PAINTFORMAT_COLR_LAYERS)) {
                      if (local_68 < colr->paints_start_v1) {
                        return '\0';
                      }
                      if ((uint *)((long)colr->table + (colr->table_size - 4)) < local_68) {
                        return '\0';
                      }
                      puVar19 = local_68 + 1;
                      uVar17 = *local_68;
                      uVar22 = (ulong)(uVar17 >> 0x18 | (uVar17 & 0xff0000) >> 8 |
                                       (uVar17 & 0xff00) << 8 | uVar17 << 0x18);
                      local_68 = puVar19;
                      if (FVar8 == (FT_COLR_PAINTFORMAT_SKEW|FT_COLR_PAINTFORMAT_COLR_LAYERS)) {
                        get_deltas_for_var_index_base
                                  (face,colr,uVar22,2,(FT_ItemVarDelta *)&local_58);
                        pFVar5 = &(paint->u).transform.affine;
                        pFVar5->xx = pFVar5->xx + (long)(int)local_58.xx * 4;
                        pFVar6 = &(paint->u).composite.backdrop_paint;
                        pFVar6->p = pFVar6->p + (long)local_58.xx._4_4_ * 4;
                      }
                      if (paint->format ==
                          (FT_COLR_PAINTFORMAT_SKEW|FT_COLR_PAINTFORMAT_SOLID|
                          FT_COLR_PAINTFORMAT_COLR_LAYERS)) {
                        get_deltas_for_var_index_base
                                  (face,colr,uVar22,4,(FT_ItemVarDelta *)&local_58);
                        pFVar5 = &(paint->u).transform.affine;
                        pFVar5->xx = pFVar5->xx + (long)(int)local_58.xx * 4;
                        pFVar6 = &(paint->u).composite.backdrop_paint;
                        pFVar6->p = pFVar6->p + (long)local_58.xx._4_4_ * 4;
                        pFVar2 = &(paint->u).composite.backdrop_paint.insert_root_transform;
                        *(long *)pFVar2 = *(long *)pFVar2 + (long)(int)local_58.xy * 0x10000;
                        pFVar3 = &(paint->u).linear_gradient.p0.y;
                        *pFVar3 = *pFVar3 + (long)local_58.xy._4_4_ * 0x10000;
                      }
                    }
                    paint->format = FT_COLR_PAINTFORMAT_SKEW;
                    return '\x01';
                  }
                  if (FVar8 != FT_COLR_PAINTFORMAT_COMPOSITE) {
                    return '\0';
                  }
                  (paint->u).glyph.paint.p = local_60;
                  *(undefined1 *)((long)&paint->u + 8) = 0;
                  if (local_68 < colr->paints_start_v1) {
                    return '\0';
                  }
                  if ((uint *)((long)colr->table + (colr->table_size - 1)) < local_68) {
                    return '\0';
                  }
                  if (0x1b < (byte)*local_68) {
                    return '\0';
                  }
                  (paint->u).glyph.glyphID = (uint)(byte)*local_68;
                  local_68 = (uint *)((long)local_68 + 1);
                  FVar14 = get_child_table_pointer
                                     (colr,(FT_Byte *)puVar19,(FT_Byte **)&local_68,&local_60);
                  if (FVar14 == '\0') {
                    return '\0';
                  }
                  (paint->u).composite.backdrop_paint.p = local_60;
                  *(undefined1 *)((long)&paint->u + 0x20) = 0;
                  return '\x01';
                }
              }
              FVar14 = read_color_line(colr,local_60,(FT_ColorLine *)&(paint->u).colr_layers,
                                       read_variable);
              if (((FVar14 != '\0') && (colr->paints_start_v1 <= local_68)) &&
                 (local_68 <= (uint *)((long)colr->table + (colr->table_size - 0xc)))) {
                (paint->u).linear_gradient.p0.x =
                     ((long)(short)((ushort)(byte)*local_68 << 8) |
                     (ulong)*(byte *)((long)local_68 + 1)) << 0x10;
                (paint->u).linear_gradient.p0.y =
                     ((long)(short)((ushort)*(byte *)((long)local_68 + 2) << 8) |
                     (ulong)*(byte *)((long)local_68 + 3)) << 0x10;
                (paint->u).linear_gradient.p1.x =
                     ((long)(short)((ushort)(byte)local_68[1] << 8) |
                     (ulong)*(byte *)((long)local_68 + 5)) << 0x10;
                (paint->u).linear_gradient.p1.y =
                     ((long)(short)((ushort)*(byte *)((long)local_68 + 6) << 8) |
                     (ulong)*(byte *)((long)local_68 + 7)) << 0x10;
                (paint->u).linear_gradient.p2.x =
                     ((long)(short)((ushort)(byte)local_68[2] << 8) |
                     (ulong)*(byte *)((long)local_68 + 9)) << 0x10;
                (paint->u).linear_gradient.p2.y =
                     ((long)(short)((ushort)*(byte *)((long)local_68 + 10) << 8) |
                     (ulong)*(byte *)((long)local_68 + 0xb)) << 0x10;
                if (read_variable != false) {
                  if (local_68 + 3 < colr->paints_start_v1) {
                    return '\0';
                  }
                  if ((uint *)((long)colr->table + (colr->table_size - 4)) < local_68 + 3) {
                    return '\0';
                  }
                  uVar17 = local_68[3];
                  local_68 = local_68 + 4;
                  get_deltas_for_var_index_base
                            (face,colr,
                             (ulong)(uVar17 >> 0x18 | (uVar17 & 0xff0000) >> 8 |
                                     (uVar17 & 0xff00) << 8 | uVar17 << 0x18),6,
                             (FT_ItemVarDelta *)&local_58);
                  pFVar2 = &(paint->u).composite.backdrop_paint.insert_root_transform;
                  *(long *)pFVar2 = *(long *)pFVar2 + (long)(int)local_58.xx * 0x10000;
                  pFVar3 = &(paint->u).linear_gradient.p0.y;
                  *pFVar3 = *pFVar3 + (long)local_58.xx._4_4_ * 0x10000;
                  pFVar4 = &(paint->u).linear_gradient.p1;
                  pFVar4->x = pFVar4->x + (long)(int)local_58.xy * 0x10000;
                  pFVar3 = &(paint->u).linear_gradient.p1.y;
                  *pFVar3 = *pFVar3 + (long)local_58.xy._4_4_ * 0x10000;
                  pFVar4 = &(paint->u).linear_gradient.p2;
                  pFVar4->x = pFVar4->x + (long)(int)local_58.yx * 0x10000;
                  pFVar3 = &(paint->u).linear_gradient.p2.y;
                  *pFVar3 = *pFVar3 + (long)local_58.yx._4_4_ * 0x10000;
                }
                paint->format = FT_COLR_PAINTFORMAT_LINEAR_GRADIENT;
                return '\x01';
              }
            }
          }
        }
      }
    }
  }
  return '\0';
}

Assistant:

FT_LOCAL_DEF( FT_Bool )
  tt_face_get_paint( TT_Face         face,
                     FT_OpaquePaint  opaque_paint,
                     FT_COLR_Paint*  paint )
  {
    Colr*           colr = (Colr*)face->colr;
    FT_OpaquePaint  next_paint;
    FT_Matrix       ft_root_scale;

    if ( !colr || !colr->base_glyphs_v1 || !colr->table )
      return 0;

    if ( opaque_paint.insert_root_transform )
    {
      /* 'COLR' v1 glyph information is returned in unscaled coordinates,
       * i.e., `FT_Size` is not applied or multiplied into the values.  When
       * client applications draw color glyphs, they can request to include
       * a top-level transform, which includes the active `x_scale` and
       * `y_scale` information for scaling the glyph, as well the additional
       * transform and translate configured through `FT_Set_Transform`.
       * This allows client applications to apply this top-level transform
       * to the graphics context first and only once, then have gradient and
       * contour scaling applied correctly when performing the additional
       * drawing operations for subsequenct paints.  Prepare this initial
       * transform here.
       */
      paint->format = FT_COLR_PAINTFORMAT_TRANSFORM;

      next_paint.p                     = opaque_paint.p;
      next_paint.insert_root_transform = 0;
      paint->u.transform.paint         = next_paint;

      /* `x_scale` and `y_scale` are in 26.6 format, representing the scale
       * factor to get from font units to requested size.  However, expected
       * return values are in 16.16, so we shift accordingly with rounding.
       */
      ft_root_scale.xx = ( face->root.size->metrics.x_scale + 32 ) >> 6;
      ft_root_scale.xy = 0;
      ft_root_scale.yx = 0;
      ft_root_scale.yy = ( face->root.size->metrics.y_scale + 32 ) >> 6;

      if ( face->root.internal->transform_flags & 1 )
        FT_Matrix_Multiply( &face->root.internal->transform_matrix,
                            &ft_root_scale );

      paint->u.transform.affine.xx = ft_root_scale.xx;
      paint->u.transform.affine.xy = ft_root_scale.xy;
      paint->u.transform.affine.yx = ft_root_scale.yx;
      paint->u.transform.affine.yy = ft_root_scale.yy;

      /* The translation is specified in 26.6 format and, according to the
       * documentation of `FT_Set_Translate`, is performed on the character
       * size given in the last call to `FT_Set_Char_Size`.  The
       * 'PaintTransform' paint table's `FT_Affine23` format expects
       * values in 16.16 format, thus we need to shift by 10 bits.
       */
      if ( face->root.internal->transform_flags & 2 )
      {
        paint->u.transform.affine.dx =
          face->root.internal->transform_delta.x * ( 1 << 10 );
        paint->u.transform.affine.dy =
          face->root.internal->transform_delta.y * ( 1 << 10 );
      }
      else
      {
        paint->u.transform.affine.dx = 0;
        paint->u.transform.affine.dy = 0;
      }

      return 1;
    }

    return read_paint( face, colr, opaque_paint.p, paint );
  }